

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseUnqualifiedName(State *state)

{
  bool bVar1;
  State *in_stack_00000018;
  State *in_stack_00000038;
  bool local_a;
  bool local_9;
  
  bVar1 = ParseOperatorName(in_stack_00000018);
  local_9 = true;
  if (!bVar1) {
    bVar1 = ParseCtorDtorName(in_stack_00000038);
    local_9 = true;
    if (!bVar1) {
      bVar1 = ParseSourceName(in_stack_00000018);
      if (bVar1) {
        bVar1 = ParseAbiTags(in_stack_00000018);
        bVar1 = Optional(bVar1);
        if (bVar1) {
          return true;
        }
      }
      bVar1 = ParseLocalSourceName(in_stack_00000018);
      local_a = false;
      if (bVar1) {
        bVar1 = ParseAbiTags(in_stack_00000018);
        local_a = Optional(bVar1);
      }
      local_9 = local_a;
    }
  }
  return local_9;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  return (ParseOperatorName(state) ||
          ParseCtorDtorName(state) ||
          (ParseSourceName(state) && Optional(ParseAbiTags(state))) ||
          (ParseLocalSourceName(state) && Optional(ParseAbiTags(state))));
}